

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool art_node_iterator_lower_bound(art_ref_t ref,art_iterator_t *iterator,art_key_chunk_t *key)

{
  undefined4 *puVar1;
  byte bVar2;
  byte bVar3;
  art_node_t *paVar4;
  _Bool _Var5;
  int iVar6;
  size_t i;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  art_typecode_t typecode_1;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  art_typecode_t typecode;
  long lVar14;
  
  uVar12 = ref & 0xff;
  while (uVar12 != 1) {
    paVar4 = iterator->art->nodes[uVar12];
    lVar14 = (ref >> 0x10) * ART_NODE_SIZES[uVar12];
    bVar2 = iterator->depth;
    uVar12 = (ulong)*(byte *)((long)paVar4 + lVar14);
    iVar6 = memcmp((byte *)((long)paVar4 + lVar14) + 1,key + bVar2,uVar12);
    if (iVar6 < 0) goto LAB_00106001;
    uVar9 = ref;
    if (iVar6 != 0) goto LAB_00106029;
    uVar8 = (uint)ref & 0xff;
    if (3 < uVar8 - 2) goto LAB_00106001;
    bVar2 = (key + bVar2)[uVar12];
    uVar12 = (ulong)bVar2;
    switch(uVar8) {
    case 2:
      uVar12 = (ulong)*(byte *)((long)paVar4 + lVar14 + 6);
      if (uVar12 == 0) goto LAB_00106001;
      uVar10 = 0;
      while (bVar3 = *(byte *)((long)paVar4 + uVar10 + lVar14 + 7), bVar3 < bVar2) {
        uVar10 = uVar10 + 1;
        if (uVar12 == uVar10) goto LAB_00106001;
      }
      uVar9 = *(ulong *)((long)paVar4 + uVar10 * 8 + lVar14 + 0x10);
      uVar10 = (ulong)bVar3 * 0x100 + uVar10;
      break;
    case 3:
      uVar9 = (ulong)*(byte *)((long)paVar4 + lVar14 + 6);
      if (uVar9 != 0) {
        uVar12 = 0;
        while (bVar3 = *(byte *)((long)paVar4 + uVar12 + lVar14 + 7), bVar3 < bVar2) {
          uVar12 = uVar12 + 1;
          if (uVar9 == uVar12) goto LAB_00106001;
        }
        uVar9 = *(ulong *)((long)paVar4 + uVar12 * 8 + lVar14 + 0x18);
        uVar10 = (ulong)bVar3;
        goto LAB_00105faa;
      }
      goto LAB_00106001;
    case 4:
      uVar10 = (ulong)CONCAT11(bVar2,bVar2);
      pbVar7 = (byte *)((long)paVar4 + lVar14 + uVar12 + 0x10);
      while ((ulong)*pbVar7 == 0x30) {
        uVar10 = uVar10 + 0x101;
        pbVar7 = pbVar7 + 1;
        if (uVar10 == 0x10100) goto LAB_00106001;
      }
      uVar9 = *(ulong *)((long)paVar4 + (ulong)*pbVar7 * 8 + lVar14 + 0x110);
      break;
    case 5:
      do {
        uVar9 = *(ulong *)((long)paVar4 + uVar12 * 8 + lVar14 + 8);
        uVar10 = uVar12;
        if (uVar9 != 0) goto LAB_00105faa;
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0x100);
      uVar12 = 0;
      uVar10 = uVar12;
LAB_00105faa:
      uVar10 = uVar10 * 0x100 + uVar12;
    }
    if (uVar9 == 0) goto LAB_00106001;
    art_iterator_down(iterator,ref,(uint8_t)uVar10);
    if ((uint)bVar2 < ((uint)(uVar10 >> 8) & 0xff)) {
LAB_00106029:
      art_node_init_iterator(uVar9,iterator,true);
      return true;
    }
    ref = uVar9;
    uVar12 = uVar9 & 0xff;
  }
  paVar4 = iterator->art->nodes[1];
  uVar12 = ref >> 0xc & 0xfffffffffffffff0;
  puVar1 = (undefined4 *)((long)paVar4 + uVar12);
  uVar8 = *(uint *)((long)paVar4 + uVar12);
  uVar13 = *(uint *)key;
  uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  if (uVar8 == uVar13) {
    uVar8 = (uint)(ushort)(*(ushort *)(puVar1 + 1) << 8 | *(ushort *)(puVar1 + 1) >> 8);
    uVar13 = (uint)(ushort)(*(ushort *)(key + 4) << 8 | *(ushort *)(key + 4) >> 8);
    uVar11 = 0;
    if (uVar8 == uVar13) goto LAB_00105e26;
  }
  uVar11 = -(uint)(uVar8 < uVar13) | 1;
LAB_00105e26:
  if (-1 < (int)uVar11) {
    bVar2 = iterator->frame;
    iterator->frames[bVar2].ref = ref;
    iterator->frames[bVar2].index_in_node = '\0';
    *(undefined2 *)(iterator->key + 4) = *(undefined2 *)(puVar1 + 1);
    *(undefined4 *)iterator->key = *puVar1;
    iterator->value = (art_val_t *)(puVar1 + 2);
    return true;
  }
LAB_00106001:
  _Var5 = art_iterator_up_and_move(iterator,true);
  return _Var5;
}

Assistant:

static bool art_node_iterator_lower_bound(art_ref_t ref,
                                          art_iterator_t *iterator,
                                          const art_key_chunk_t key[]) {
    while (!art_is_leaf(ref)) {
        art_inner_node_t *inner_node =
            (art_inner_node_t *)art_deref(iterator->art, ref);
        int prefix_comparison =
            art_compare_prefix(inner_node->prefix, 0, key, iterator->depth,
                               inner_node->prefix_size);
        if (prefix_comparison < 0) {
            // Prefix so far has been equal, but we've found a smaller key.
            // Since we take the lower bound within each node, we can return
            // the next leaf.
            return art_iterator_up_and_move(iterator, true);
        } else if (prefix_comparison > 0) {
            // No key equal to the key we're looking for, return the first
            // leaf.
            return art_node_init_iterator(ref, iterator, true);
        }
        // Prefix is equal, move to lower bound child.
        art_key_chunk_t key_chunk =
            key[iterator->depth + inner_node->prefix_size];
        art_indexed_child_t indexed_child = art_node_lower_bound(
            (art_node_t *)inner_node, art_ref_typecode(ref), key_chunk);
        if (indexed_child.child == CROARING_ART_NULL_REF) {
            // Only smaller keys among children.
            return art_iterator_up_and_move(iterator, true);
        }
        if (indexed_child.key_chunk > key_chunk) {
            // Only larger children, return the first larger child.
            art_iterator_down(iterator, ref, indexed_child.index);
            return art_node_init_iterator(indexed_child.child, iterator, true);
        }
        // We found a child with an equal prefix.
        art_iterator_down(iterator, ref, indexed_child.index);
        ref = indexed_child.child;
    }
    art_leaf_t *leaf = (art_leaf_t *)art_deref(iterator->art, ref);
    if (art_compare_keys(leaf->key, key) >= 0) {
        // Leaf has an equal or larger key.
        return art_iterator_valid_loc(iterator, ref);
    }
    // Leaf has an equal prefix, but the full key is smaller. Move to the
    // next leaf.
    return art_iterator_up_and_move(iterator, true);
}